

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

Constant * __thiscall flow::lang::IRGenerator::getConstant(IRGenerator *this,Expr *expr)

{
  Report *this_00;
  LiteralType args;
  long lVar1;
  ConstantString *pCVar2;
  ConstantRegExp *pCVar3;
  allocator<char> local_31;
  string local_30;
  
  if (expr != (Expr *)0x0) {
    lVar1 = __dynamic_cast(expr,&Expr::typeinfo,&LiteralExpr<std::__cxx11::string>::typeinfo,0);
    if (lVar1 != 0) {
      pCVar2 = IRBuilder::get(&this->super_IRBuilder,(string *)(lVar1 + 0x40));
      return &pCVar2->super_Constant;
    }
    lVar1 = __dynamic_cast(expr,&Expr::typeinfo,&LiteralExpr<flow::util::RegExp>::typeinfo,0);
    if (lVar1 != 0) {
      pCVar3 = IRBuilder::get(&this->super_IRBuilder,(RegExp *)(lVar1 + 0x40));
      return &pCVar3->super_Constant;
    }
  }
  this_00 = this->report_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"FIXME: Invalid (unsupported) literal type <{}> in match case.",
             &local_31);
  args = (*(expr->super_ASTNode)._vptr_ASTNode[3])(expr);
  diagnostics::Report::typeError<flow::LiteralType>
            (this_00,&(expr->super_ASTNode).location_,&local_30,args);
  std::__cxx11::string::~string((string *)&local_30);
  return (Constant *)0x0;
}

Assistant:

Constant* IRGenerator::getConstant(Expr* expr) {
  if (auto e = dynamic_cast<StringExpr*>(expr))
    return get(e->value());
  else if (auto e = dynamic_cast<RegExpExpr*>(expr))
    return get(e->value());
  else {
    report_->typeError(expr->location(),
                       "FIXME: Invalid (unsupported) literal type <{}> in match case.",
                       expr->getType());
    return nullptr;
  }
}